

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

size_t __thiscall
libchars::commands::render(commands *this,size_t buf_idx,size_t limit,string *sequence)

{
  size_t sVar1;
  size_t __n;
  size_t sVar2;
  string local_78 [32];
  reference local_58;
  command_char *C_1;
  command_char *C;
  size_t r_length;
  size_t r_offset;
  size_t displayed;
  size_t idx;
  string *sequence_local;
  size_t limit_local;
  size_t buf_idx_local;
  commands *this_local;
  
  idx = (size_t)sequence;
  sequence_local = (string *)limit;
  limit_local = buf_idx;
  buf_idx_local = (size_t)this;
  parse(this);
  displayed = limit_local;
  r_offset = 0;
  r_length = 0;
  C = (command_char *)0x0;
  while (sVar1 = displayed, sVar2 = edit_object::length(&this->super_edit_object), __n = displayed,
        sVar1 < sVar2 && r_offset < sequence_local) {
    displayed = displayed + 1;
    C_1 = std::vector<libchars::command_char,_std::allocator<libchars::command_char>_>::operator[]
                    (&this->characters,__n);
    if (sequence_local < (string *)(r_offset + C_1->display_length)) break;
    if (C == (command_char *)0x0) {
      r_length = C_1->render_offset;
      C = (command_char *)C_1->render_length;
    }
    else {
      C = (command_char *)((long)&C->T + C_1->render_length);
    }
    r_offset = C_1->display_length + r_offset;
  }
  if (C == (command_char *)0x0) {
    std::__cxx11::string::clear();
  }
  else {
    local_58 = std::vector<libchars::command_char,_std::allocator<libchars::command_char>_>::
               operator[](&this->characters,limit_local);
    sVar1 = idx;
    if ((local_58->T != (token *)0x0) && (local_58->T->offset < limit_local)) {
      color_str(this,local_58->color);
      std::__cxx11::string::append((char *)sVar1);
    }
    std::__cxx11::string::substr((ulong)local_78,(ulong)&this->rendered_str);
    std::__cxx11::string::operator=((string *)idx,local_78);
    std::__cxx11::string::~string(local_78);
    sVar1 = idx;
    color_str(this,COLOR_NORMAL);
    std::__cxx11::string::append((char *)sVar1);
  }
  return r_offset;
}

Assistant:

size_t commands::render(size_t buf_idx, size_t limit, std::string &sequence)
    {
        parse();

        size_t idx = buf_idx, displayed = 0, r_offset = 0, r_length = 0;
        while (idx < length() && displayed < limit) {
            command_char &C = characters[idx++];
            if ((displayed + C.display_length) > limit)
                break;
            if (r_length == 0) {
                r_offset = C.render_offset;
                r_length = C.render_length;
            }
            else {
                r_length += C.render_length;
            }
            displayed += C.display_length;
        }

        if (r_length > 0) {
            // add token color if render has to start in the middle of a token
            command_char &C = characters[buf_idx];
            if (C.T != NULL && buf_idx > C.T->offset)
                sequence.append(color_str(C.color));
            sequence = rendered_str.substr(r_offset, r_length);
            sequence.append(color_str(COLOR_NORMAL)); // just in case the rest of the terminal gets messed up
        }
        else {
            sequence.clear();
        }

        return displayed;
    }